

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall
HashUtil_Ripemd160ByOperator_Test::~HashUtil_Ripemd160ByOperator_Test
          (HashUtil_Ripemd160ByOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Ripemd160ByOperator) {
  ByteData byte_data = (HashUtil(HashUtil::kRipemd160)
      << "The quick brown fox jumps over the lazy dog").Output();
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "37f332f68db77bd9d7edd4969571ad671cf9dd3b");

  byte_data = (HashUtil(HashUtil::kRipemd160)
      << ByteData("0123456789abcdef")).Output();
  EXPECT_STREQ(byte_data.GetHex().c_str(), "cea1b21f1a739fba68d1d4290437d2c5609be1d3");

  byte_data = (HashUtil(HashUtil::kRipemd160)
      << ByteData160("0123456789abcdef0123456789abcdef01234567")).Output();
  EXPECT_STREQ(byte_data.GetHex().c_str(), "49ec9207a365f6f330d529ca2a79e23a7ea2b526");

  auto bytedata160 = (HashUtil(HashUtil::kRipemd160)
      << ByteData160("0123456789abcdef0123456789abcdef01234567")).Output160();
  EXPECT_STREQ(bytedata160.GetHex().c_str(), "49ec9207a365f6f330d529ca2a79e23a7ea2b526");

  byte_data = (HashUtil(HashUtil::kRipemd160)
      << ByteData256("1234567890123456789012345678901234567890123456789012345678901234")).Output();
  EXPECT_STREQ(byte_data.GetHex().c_str(), "a5b1c86f10c81c3c543304e9891815d8de036296");

  byte_data = (HashUtil(HashUtil::kRipemd160)
      << Pubkey("032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db")).Output();
  EXPECT_STREQ(byte_data.GetHex().c_str(), "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");

  byte_data = (HashUtil(HashUtil::kRipemd160)
      << Script("21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac")).Output();
  EXPECT_STREQ(byte_data.GetHex().c_str(), "6be854f95bade5490a020c3841c50d08339a5c89");
}